

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O1

string * embree::getExecutableFileName_abi_cxx11_(void)

{
  bool bVar1;
  uint uVar2;
  __pid_t _Var3;
  long *plVar4;
  ssize_t sVar5;
  ulong uVar6;
  long *plVar7;
  string *in_RDI;
  uint __len;
  ulong __val;
  ulong uVar8;
  string pid;
  string __str;
  char buf [4096];
  long *local_1078;
  long local_1068;
  long lStack_1060;
  undefined1 *local_1058 [2];
  undefined1 local_1048 [16];
  long *local_1038;
  long local_1030;
  long local_1028;
  long lStack_1020;
  
  _Var3 = getpid();
  uVar8 = (ulong)_Var3;
  __val = -uVar8;
  if (0 < (long)uVar8) {
    __val = uVar8;
  }
  __len = 1;
  if (9 < __val) {
    uVar6 = __val;
    uVar2 = 4;
    do {
      __len = uVar2;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_001dc353;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_001dc353;
      }
      if (uVar6 < 10000) goto LAB_001dc353;
      bVar1 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      uVar2 = __len + 4;
    } while (bVar1);
    __len = __len + 1;
  }
LAB_001dc353:
  local_1058[0] = local_1048;
  std::__cxx11::string::_M_construct((ulong)local_1058,(char)__len - (char)(_Var3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            (local_1058[0] + -((long)uVar8 >> 0x3f),__len,__val);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_1058,0,(char *)0x0,0x25ccf6);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_1028 = *plVar7;
    lStack_1020 = plVar4[3];
    local_1038 = &local_1028;
  }
  else {
    local_1028 = *plVar7;
    local_1038 = (long *)*plVar4;
  }
  local_1030 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1038);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_1068 = *plVar7;
    lStack_1060 = plVar4[3];
    local_1078 = &local_1068;
  }
  else {
    local_1068 = *plVar7;
    local_1078 = (long *)*plVar4;
  }
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_1038 != &local_1028) {
    operator_delete(local_1038);
  }
  if (local_1058[0] != local_1048) {
    operator_delete(local_1058[0]);
  }
  memset(&local_1038,0,0x1000);
  sVar5 = readlink((char *)local_1078,(char *)&local_1038,0xfff);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if (sVar5 == -1) {
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  else {
    strlen((char *)&local_1038);
    std::__cxx11::string::_M_construct<char_const*>();
  }
  if (local_1078 != &local_1068) {
    operator_delete(local_1078);
  }
  return in_RDI;
}

Assistant:

std::string getExecutableFileName() 
  {
    std::string pid = "/proc/" + toString(getpid()) + "/exe";
    char buf[4096];
    memset(buf,0,sizeof(buf));
    if (readlink(pid.c_str(), buf, sizeof(buf)-1) == -1)
      return std::string();
    return std::string(buf);
  }